

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keyword.cpp
# Opt level: O2

string * __thiscall
ninx::lexer::token::Keyword::dump_abi_cxx11_(string *__return_storage_ptr__,Keyword *this)

{
  ostream *poVar1;
  stringstream s;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"KEYWORD ( type ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->type);
  poVar1 = std::operator<<(poVar1," late:");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1," ): \'");
  poVar1 = std::operator<<(poVar1,(string *)&this->keyword);
  std::operator<<(poVar1,"\'");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::lexer::token::Keyword::dump() const {
    std::stringstream s;
    s << "KEYWORD ( type " << static_cast<int>(this-> type) << " late:" << this->late << " ): '" << this->keyword << "'";
    return s.str();
}